

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O2

void __thiscall node::MiniMiner::SanityCheck(MiniMiner *this)

{
  long lVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (p_Var3 = (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    cVar2 = std::
            _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
            ::find(&(this->m_entries_by_txid)._M_t,(key_type *)(p_Var3 + 1));
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header) break;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MiniMiner::SanityCheck() const
{
    // m_entries, m_entries_by_txid, and m_descendant_set_by_txid all same size
    Assume(m_entries.size() == m_entries_by_txid.size());
    Assume(m_entries.size() == m_descendant_set_by_txid.size());
    // Cached ancestor values should be at least as large as the transaction's own fee and size
    Assume(std::all_of(m_entries.begin(), m_entries.end(), [](const auto& entry) {
        return entry->second.GetSizeWithAncestors() >= entry->second.GetTxSize() &&
               entry->second.GetModFeesWithAncestors() >= entry->second.GetModifiedFee();}));
    // None of the entries should be to-be-replaced transactions
    Assume(std::all_of(m_to_be_replaced.begin(), m_to_be_replaced.end(),
        [&](const auto& txid){return m_entries_by_txid.find(txid) == m_entries_by_txid.end();}));
}